

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O0

bool __thiscall Omega_h::Future<int>::completed(Future<int> *this)

{
  Future<int> *this_local;
  
  return true;
}

Assistant:

bool Future<T>::completed() {
#ifdef OMEGA_H_USE_MPI
  if (status_ != Status::waiting) {
    return true;
  }
  int flag = 0;
  OMEGA_H_CHECK(
      MPI_SUCCESS == MPI_Testall(static_cast<int>(requests_.size()),
                         requests_.data(), &flag, MPI_STATUSES_IGNORE));
  if (flag == 0) {
    status_ = Status::completed;
  }
  return flag == 0;
#else   // !OMEGA_H_USE_MPI
  return true;
#endif  // OMEGA_H_USE_MPI
}